

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QAccessibleInterface * __thiscall
QAccessibleDockWidget::child(QAccessibleDockWidget *this,int index)

{
  QWidget *pQVar1;
  QAccessibleInterface *pQVar2;
  QDockWidgetLayout *pQVar3;
  long *plVar4;
  QObject *pQVar5;
  int in_ESI;
  QLayoutItem *item;
  QDockWidget *in_stack_ffffffffffffffe0;
  
  dockWidget((QAccessibleDockWidget *)0x7e54bf);
  pQVar1 = QDockWidget::titleBarWidget(in_stack_ffffffffffffffe0);
  if (pQVar1 == (QWidget *)0x0) {
    pQVar3 = dockWidgetLayout((QAccessibleDockWidget *)0x7e5544);
    plVar4 = (long *)(**(code **)(*(long *)&pQVar3->super_QLayout + 0xa8))(pQVar3,in_ESI);
    if (plVar4 != (long *)0x0) {
      pQVar5 = (QObject *)(**(code **)(*plVar4 + 0x68))();
      pQVar2 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar5);
      return pQVar2;
    }
  }
  else {
    dockWidget((QAccessibleDockWidget *)0x7e54d6);
    pQVar1 = QDockWidget::widget(in_stack_ffffffffffffffe0);
    if (((pQVar1 == (QWidget *)0x0) && (in_ESI == 0)) || (in_ESI == 1)) {
      dockWidget((QAccessibleDockWidget *)0x7e54fb);
      pQVar1 = QDockWidget::titleBarWidget(in_stack_ffffffffffffffe0);
      pQVar2 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(&pQVar1->super_QObject)
      ;
      return pQVar2;
    }
    if (in_ESI == 0) {
      dockWidget((QAccessibleDockWidget *)0x7e5522);
      pQVar1 = QDockWidget::widget(in_stack_ffffffffffffffe0);
      pQVar2 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(&pQVar1->super_QObject)
      ;
      return pQVar2;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleDockWidget::child(int index) const
{
    if (dockWidget()->titleBarWidget()) {
        if ((!dockWidget()->widget() && index == 0) || (index == 1))
            return QAccessible::queryAccessibleInterface(dockWidget()->titleBarWidget());
        if (index == 0)
            return QAccessible::queryAccessibleInterface(dockWidget()->widget());
    } else {
        QLayoutItem *item = dockWidgetLayout()->itemAt(index);
        if (item)
            return QAccessible::queryAccessibleInterface(item->widget());
    }
    return nullptr;
}